

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_tests.cpp
# Opt level: O3

set<CPubKey,_std::less<CPubKey>,_std::allocator<CPubKey>_> *
anon_unknown.dwarf_8e5514::GetKeyData
          (set<CPubKey,_std::less<CPubKey>,_std::allocator<CPubKey>_> *__return_storage_ptr__,
          FlatSigningProvider *provider,int flags)

{
  CPubKey *__v;
  byte bVar1;
  _Base_ptr p_Var2;
  byte bVar3;
  size_t __n;
  iterator in_R8;
  iterator in_R9;
  _Rb_tree_header *p_Var4;
  long in_FS_OFFSET;
  const_string file;
  const_string msg;
  undefined4 local_150;
  undefined4 local_14c;
  lazy_ostream local_148;
  undefined1 *local_138;
  char *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  char *local_118;
  char *local_110;
  undefined4 *local_108;
  undefined **local_100;
  undefined1 local_f8;
  undefined1 *local_f0;
  undefined4 **local_e8;
  undefined4 *local_e0;
  char *local_d8;
  char *local_d0;
  assertion_result local_c8;
  CPubKey norm_pubkey;
  uchar bytes [33];
  uchar local_47 [15];
  set<CPubKey,_std::less<CPubKey>,_std::allocator<CPubKey>_> *local_38;
  
  local_38 = *(set<CPubKey,_std::less<CPubKey>,_std::allocator<CPubKey>_> **)(in_FS_OFFSET + 0x28);
  p_Var4 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var4->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var4->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = (provider->pubkeys)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var4 = &(provider->pubkeys)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 != p_Var4) {
    do {
      __v = (CPubKey *)((long)&p_Var2[1]._M_left + 4);
      if ((flags & 0x40U) == 0) {
        std::
        _Rb_tree<CPubKey,CPubKey,std::_Identity<CPubKey>,std::less<CPubKey>,std::allocator<CPubKey>>
        ::_M_insert_unique<CPubKey_const&>
                  ((_Rb_tree<CPubKey,CPubKey,std::_Identity<CPubKey>,std::less<CPubKey>,std::allocator<CPubKey>>
                    *)__return_storage_ptr__,__v);
      }
      else {
        local_118 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
        ;
        local_110 = "";
        local_128 = &boost::unit_test::basic_cstring<char_const>::null;
        local_120 = &boost::unit_test::basic_cstring<char_const>::null;
        file.m_end = (iterator)0x66;
        file.m_begin = (iterator)&local_118;
        msg.m_end = in_R9;
        msg.m_begin = in_R8;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_128,
                   msg);
        local_148.m_empty = false;
        local_148._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
        local_138 = boost::unit_test::lazy_ostream::inst;
        local_130 = "";
        bVar1 = __v->vch[0] & 0xfe;
        local_14c = 0x21;
        if (bVar1 != 2) {
          bVar3 = __v->vch[0] - 4;
          local_14c = 0;
          if (bVar3 < 4) {
            local_14c = *(undefined4 *)(&DAT_00e5e140 + (ulong)bVar3 * 4);
          }
        }
        local_c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
             (readonly_property<bool>)(bVar1 == 2);
        local_150 = 0x21;
        local_c8.m_message.px = (element_type *)0x0;
        local_c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
        local_d8 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
        ;
        local_d0 = "";
        local_e0 = &local_14c;
        norm_pubkey.vch[8] = '\0';
        norm_pubkey.vch._0_8_ = &PTR__lazy_ostream_01388f88;
        norm_pubkey.vch._16_8_ = boost::unit_test::lazy_ostream::inst;
        norm_pubkey.vch._24_8_ = &local_e0;
        local_108 = &local_150;
        local_f8 = 0;
        local_100 = &PTR__lazy_ostream_013890c8;
        local_f0 = boost::unit_test::lazy_ostream::inst;
        local_e8 = &local_108;
        in_R8 = (iterator)0x1;
        in_R9 = (iterator)0x2;
        boost::test_tools::tt_detail::report_assertion
                  (&local_c8,&local_148,1,2,REQUIRE,0xe72efa,(size_t)&local_d8,0x66,&norm_pubkey,
                   "33",&local_100);
        boost::detail::shared_count::~shared_count(&local_c8.m_message.pn);
        bVar1 = __v->vch[0];
        __n = 0x21;
        if (((bVar1 & 0xfe) == 2) ||
           ((bVar1 < 8 && (__n = 0x41, (0xd0U >> (bVar1 & 0x1f) & 1) != 0)))) {
          memmove(bytes,__v,__n);
        }
        bytes[0] = '\x02';
        CPubKey::Set<unsigned_char_const*>(&norm_pubkey,bytes,local_47);
        std::
        _Rb_tree<CPubKey,CPubKey,std::_Identity<CPubKey>,std::less<CPubKey>,std::allocator<CPubKey>>
        ::_M_insert_unique<CPubKey_const&>
                  ((_Rb_tree<CPubKey,CPubKey,std::_Identity<CPubKey>,std::less<CPubKey>,std::allocator<CPubKey>>
                    *)__return_storage_ptr__,&norm_pubkey);
      }
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var4);
  }
  if (*(set<CPubKey,_std::less<CPubKey>,_std::allocator<CPubKey>_> **)(in_FS_OFFSET + 0x28) ==
      local_38) {
    return *(set<CPubKey,_std::less<CPubKey>,_std::allocator<CPubKey>_> **)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

std::set<CPubKey> GetKeyData(const FlatSigningProvider& provider, int flags) {
    std::set<CPubKey> ret;
    for (const auto& [_, pubkey] : provider.pubkeys) {
        if (flags & XONLY_KEYS) {
            unsigned char bytes[33];
            BOOST_CHECK_EQUAL(pubkey.size(), 33);
            std::copy(pubkey.begin(), pubkey.end(), bytes);
            bytes[0] = 0x02;
            CPubKey norm_pubkey{bytes};
            ret.insert(norm_pubkey);
        } else {
            ret.insert(pubkey);
        }
    }
    return ret;
}